

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O1

string * cfd::api::json::JsonMappingApi::ElementsDecodeRawTransaction
                   (string *__return_storage_ptr__,string *request_message)

{
  function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
  *in_RCX;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = ElementsTransactionJsonApi::DecodeRawTransaction;
  local_18._8_8_ =
       std::
       _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
       ::_M_manager;
  ExecuteDirectApi<cfd::api::json::ElementsDecodeRawTransactionRequest,cfd::api::json::ElementsDecodeRawTransactionResponse>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::ElementsDecodeRawTransaction(
    const std::string &request_message) {
  return ExecuteDirectApi<
      ElementsDecodeRawTransactionRequest,
      ElementsDecodeRawTransactionResponse>(
      request_message, ElementsTransactionJsonApi::DecodeRawTransaction);
}